

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckEqualFailureBecauseOfExceptionIncludesCheckContents::
~TestCheckEqualFailureBecauseOfExceptionIncludesCheckContents
          (TestCheckEqualFailureBecauseOfExceptionIncludesCheckContents *this)

{
  TestCheckEqualFailureBecauseOfExceptionIncludesCheckContents *this_local;
  
  ~TestCheckEqualFailureBecauseOfExceptionIncludesCheckContents(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckEqualFailureBecauseOfExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_EQUAL(ThrowingFunction(), 123);
    }

    CHECK(strstr(reporter.lastFailedMessage, "ThrowingFunction()"));
    CHECK(strstr(reporter.lastFailedMessage, "123"));
}